

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdapStrategy.cpp
# Opt level: O2

optional<Vault::AuthenticationResponse> * __thiscall
Vault::LdapStrategy::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,LdapStrategy *this,
          Client *client)

{
  Url local_80;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  string local_40 [32];
  
  std::__cxx11::string::string(local_40,(string *)&this->username_);
  getUrl(&local_80,client,(Path *)local_40);
  local_60._8_8_ = 0;
  local_48 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/strategies/LdapStrategy.cpp:12:55)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/strategies/LdapStrategy.cpp:12:55)>
             ::_M_manager;
  local_60._M_unused._M_object = this;
  HttpConsumer::authenticate(__return_storage_ptr__,client,&local_80,(NoArgJsonProducer *)&local_60)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
Vault::LdapStrategy::authenticate(const Vault::Client &client) {
  return Vault::HttpConsumer::authenticate(
      client, getUrl(client, Vault::Path{username_}), [&]() {
        nlohmann::json j;
        j = nlohmann::json::object();
        j["password"] = password_;
        return j.dump();
      });
}